

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

void initDefaultMaterial(double ka,double kd,double ks,double kr,double kt,Color *color,Medium med,
                        int phong)

{
  int phong_local;
  Color *color_local;
  double kt_local;
  double kr_local;
  double ks_local;
  double kd_local;
  double ka_local;
  Medium med_local;
  
  defaultMaterial.ka = ka;
  defaultMaterial.kd = kd;
  defaultMaterial.ks = ks;
  defaultMaterial.kr = kr;
  defaultMaterial.kt = kt;
  Vector::operator=(&defaultMaterial.color,color);
  defaultMaterial.med.ior = med.ior;
  defaultMaterial.med.beta = med.beta;
  defaultMaterial.p = phong;
  return;
}

Assistant:

void initDefaultMaterial(double ka, double kd, double ks, double kr, double kt, Color color, Grayzer::Medium med, int phong)
{
   defaultMaterial.ka     = ka;
   defaultMaterial.kd     = kd;
   defaultMaterial.ks     = ks;
   defaultMaterial.kr     = kr;
   defaultMaterial.kt     = kt;
   defaultMaterial.color  = color;
   defaultMaterial.med    = med;
   defaultMaterial.p      = phong;
}